

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_shr8i_mips64el(void *d,void *a,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    *(byte *)((long)d + uVar2) = *(byte *)((long)a + uVar2) >> ((byte)((int)desc >> 10) & 0x1f);
    uVar2 = uVar2 + 1;
  } while (uVar1 + 8 != uVar2);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_shr8i_mips64el_cold_1();
  return;
}

Assistant:

void HELPER(gvec_shr8i)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    int shift = simd_data(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        *(uint8_t *)((char *)d + i) = *(uint8_t *)((char *)a + i) >> shift;
    }
    clear_high(d, oprsz, desc);
}